

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log_messages.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Message MVar1;
  pointer pMVar2;
  hrgls_Status hVar3;
  char *pcVar4;
  size_t sVar5;
  ostream *poVar6;
  long *plVar7;
  int iVar8;
  Message *copy;
  timeval tVar9;
  timeval tVar10;
  API api;
  hrgls_MessageLevel ret;
  size_t count;
  Message m;
  vector<hrgls::Message,_std::allocator<hrgls::Message>_> messages;
  API AStack_a8;
  int local_9c;
  ulong local_98;
  Message local_90;
  __time_t local_88;
  vector<hrgls::Message,_std::allocator<hrgls::Message>_> local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,hrgls::ANONYMOUS_USER_abi_cxx11_,
             DAT_0010b2e8 + hrgls::ANONYMOUS_USER_abi_cxx11_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_68,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)hrgls::NO_CREDENTIALS);
  hrgls::API::API(&AStack_a8,&local_50,&local_68);
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  hVar3 = hrgls::API::GetStatus(&AStack_a8);
  if (hVar3 == 0) {
    local_98 = 0;
    hrgls::API::SetLogMessageCallback(&AStack_a8,HandleMessageCallback,&local_98);
    hVar3 = hrgls::API::GetStatus(&AStack_a8);
    if (hVar3 == 0) {
      hrgls::API::SetLogMessageStreamingState(&AStack_a8,true);
      hVar3 = hrgls::API::GetStatus(&AStack_a8);
      if (hVar3 == 0) {
        tVar9 = hrgls::API::GetCurrentSystemTime(&AStack_a8);
        do {
          if (4 < local_98) {
            hrgls::API::SetLogMessageStreamingState(&AStack_a8,false);
            hVar3 = hrgls::API::GetStatus(&AStack_a8);
            if (hVar3 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Could not set streaming state off: ",0x23);
              pcVar4 = (char *)hrgls_ErrorMessage(hVar3);
              poVar6 = std::operator<<((ostream *)&std::cerr,pcVar4);
              iVar8 = 5;
              std::endl<char,std::char_traits<char>>(poVar6);
              goto LAB_00105531;
            }
            hrgls::API::SetLogMessageCallback(&AStack_a8,(LogMessageCallback)0x0,(void *)0x0);
            hVar3 = hrgls::API::GetStatus(&AStack_a8);
            if (hVar3 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Could not reset callback handler: ",0x22);
              pcVar4 = (char *)hrgls_ErrorMessage(hVar3);
              poVar6 = std::operator<<((ostream *)&std::cerr,pcVar4);
              iVar8 = 6;
              std::endl<char,std::char_traits<char>>(poVar6);
              goto LAB_00105531;
            }
            hrgls::API::SetLogMessageMinimumLevel(&AStack_a8,0);
            hVar3 = hrgls::API::GetStatus(&AStack_a8);
            if (hVar3 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Could not set minimum message level: ",0x25);
              pcVar4 = (char *)hrgls_ErrorMessage(hVar3);
              poVar6 = std::operator<<((ostream *)&std::cerr,pcVar4);
              iVar8 = 100;
              std::endl<char,std::char_traits<char>>(poVar6);
              goto LAB_00105531;
            }
            hrgls::API::SetLogMessageStreamingState(&AStack_a8,true);
            hVar3 = hrgls::API::GetStatus(&AStack_a8);
            if (hVar3 == 0) {
              local_98 = 0;
              tVar9 = hrgls::API::GetCurrentSystemTime(&AStack_a8);
              local_88 = tVar9.tv_sec;
              goto LAB_001056cf;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Could not set streaming state on: ",0x22);
            pcVar4 = (char *)hrgls_ErrorMessage(hVar3);
            poVar6 = std::operator<<((ostream *)&std::cerr,pcVar4);
            iVar8 = 7;
            std::endl<char,std::char_traits<char>>(poVar6);
            goto LAB_00105531;
          }
          tVar10 = hrgls::API::GetCurrentSystemTime(&AStack_a8);
        } while (tVar10.tv_sec - tVar9.tv_sec < 6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Timeout waiting for callback-based messages.",0x2c);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
        std::ostream::put(-0x10);
        iVar8 = 4;
        std::ostream::flush();
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Could not set streaming state on: ",0x22);
        pcVar4 = (char *)hrgls_ErrorMessage(hVar3);
        if (pcVar4 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10c2f0);
        }
        else {
          sVar5 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
        std::ostream::put(-0x10);
        iVar8 = 3;
        std::ostream::flush();
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Could not set callback handler: ",0x20);
      pcVar4 = (char *)hrgls_ErrorMessage(hVar3);
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10c2f0);
      }
      else {
        sVar5 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
      std::ostream::put(-0x10);
      iVar8 = 2;
      std::ostream::flush();
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not Open API: ",0x14);
    pcVar4 = (char *)hrgls_ErrorMessage(hVar3);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10c2f0);
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
    std::ostream::put(-0x10);
    iVar8 = 1;
    std::ostream::flush();
  }
  goto LAB_00105531;
LAB_001056cf:
  do {
    hrgls::API::GetPendingLogMessages(&local_80,&AStack_a8,0);
    hVar3 = hrgls::API::GetStatus(&AStack_a8);
    pMVar2 = local_80.super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (hVar3 != 1) {
      if (hVar3 == 0) {
        local_98 = local_98 +
                   ((long)local_80.
                          super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_80.
                          super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3);
        for (copy = local_80.super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>.
                    _M_impl.super__Vector_impl_data._M_start; pMVar2 != copy; copy = copy + 1) {
          hrgls::Message::Message(&local_90,copy);
          MVar1.m_private = local_90.m_private;
          local_9c = 0;
          if ((local_90.m_private)->Message == (hrgls_Message)0x0) {
            (local_90.m_private)->status = 0x3ee;
          }
          else {
            hVar3 = hrgls_MessageGetLevel();
            (MVar1.m_private)->status = hVar3;
            if (local_9c < 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Too-low message level: ",0x17);
              local_9c = 0;
              if ((MVar1.m_private)->Message == (hrgls_Message)0x0) {
                (MVar1.m_private)->status = 0x3ee;
              }
              else {
                hVar3 = hrgls_MessageGetLevel((MVar1.m_private)->Message,&local_9c);
                (MVar1.m_private)->status = hVar3;
              }
              plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cerr,local_9c);
              std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
              std::ostream::put((char)plVar7);
              std::ostream::flush();
              hrgls::Message::~Message(&local_90);
              iVar8 = 0x65;
              goto LAB_0010587c;
            }
          }
          hrgls::Message::~Message(&local_90);
        }
        goto LAB_00105767;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error reading messages: ",0x18);
      pcVar4 = (char *)hrgls_ErrorMessage(hVar3);
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10c2f0);
      }
      else {
        sVar5 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
      std::ostream::put(-0x10);
      iVar8 = 8;
      std::ostream::flush();
LAB_0010587c:
      std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>::~vector(&local_80);
      goto LAB_00105531;
    }
LAB_00105767:
    tVar9 = hrgls::API::GetCurrentSystemTime(&AStack_a8);
    if (5 < tVar9.tv_sec - local_88) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Timeout waiting for get-based messages.",0x27);
      iVar8 = 9;
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      goto LAB_0010587c;
    }
    std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>::~vector(&local_80);
  } while (local_98 < 5);
  hrgls::API::SetLogMessageStreamingState(&AStack_a8,false);
  hVar3 = hrgls::API::GetStatus(&AStack_a8);
  if (hVar3 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Success!",8);
    iVar8 = 0;
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not set streaming state off: ",0x23);
    pcVar4 = (char *)hrgls_ErrorMessage(hVar3);
    poVar6 = std::operator<<((ostream *)&std::cerr,pcVar4);
    iVar8 = 10;
    std::endl<char,std::char_traits<char>>(poVar6);
  }
LAB_00105531:
  hrgls::API::~API(&AStack_a8);
  return iVar8;
}

Assistant:

int main(int argc, const char *argv[])
{
  // Get a base API object and, specifying default parameters.
  hrgls::API api;
  hrgls_Status status = api.GetStatus();
  if (status != hrgls_STATUS_OKAY) {
    std::cerr << "Could not Open API: "
      << hrgls_ErrorMessage(status) << std::endl;
    return 1;
  }

  size_t count = 0;
  { /// Read messages using a callback handler.

    // Set a callback handler for incoming messages and then start streaming.
    api.SetLogMessageCallback(HandleMessageCallback, &count);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not set callback handler: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 2;
    }
    api.SetLogMessageStreamingState(true);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not set streaming state on: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 3;
    }

    // Run until we have 5 messages or we time out.
    struct timeval start = api.GetCurrentSystemTime();
    while (count < 5) {
      struct timeval now = api.GetCurrentSystemTime();
      if (now.tv_sec - start.tv_sec > 5) {
        std::cerr << "Timeout waiting for callback-based messages." << std::endl;
        return 4;
      }
    };

    // Unhook the callback handler after stopping the stream.
    api.SetLogMessageStreamingState(false);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not set streaming state off: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 5;
    }
    api.SetLogMessageCallback(nullptr, nullptr);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not reset callback handler: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 6;
    }
  }

  // Set a minimum threshold for the messages at warning for the
  // get-based test and ensure that we don't get any messages with
  // lower level than that.

  api.SetLogMessageMinimumLevel(hrgls_MESSAGE_MINIMUM_WARNING);
  status = api.GetStatus();
  if (status != hrgls_STATUS_OKAY) {
    std::cerr << "Could not set minimum message level: "
      << hrgls_ErrorMessage(status) << std::endl;
    return 100;
  }

  { /// Read the message without a callback handler.

    // Start streaming
    api.SetLogMessageStreamingState(true);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not set streaming state on: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 7;
    }

    count = 0;
    struct timeval start = api.GetCurrentSystemTime();
    do {
      std::vector<hrgls::Message> messages = api.GetPendingLogMessages();
      hrgls_Status status = api.GetStatus();
      if (hrgls_STATUS_OKAY == status) {
        count += messages.size();
        // Make sure we didn't get any messages below the minimum level.
        for (auto m : messages) {
          if (m.Level() < hrgls_MESSAGE_MINIMUM_WARNING) {
            std::cerr << "Too-low message level: " << m.Level() << std::endl;
            return 101;
          }
        }
      } else if (status != hrgls_STATUS_TIMEOUT) {
        std::cerr << "Error reading messages: " << hrgls_ErrorMessage(status) << std::endl;
        return 8;
      }

      struct timeval now = api.GetCurrentSystemTime();
      if (now.tv_sec - start.tv_sec > 5) {
        std::cerr << "Timeout waiting for get-based messages." << std::endl;
        return 9;
      }

    } while (count < 5);

    // Stop streaming
    api.SetLogMessageStreamingState(false);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not set streaming state off: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 10;
    }
  }

  std::cout << "Success!" << std::endl;
  return 0;
}